

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O2

void handle_2misc_reciprocal
               (DisasContext_conflict1 *s,int opcode,_Bool is_scalar,_Bool is_u,_Bool is_q,int size,
               int rn,int rd)

{
  byte is_q_00;
  TCGTemp *pTVar1;
  TCGv_i32 pTVar2;
  undefined7 in_register_00000009;
  int iVar3;
  undefined7 in_register_00000011;
  TCGv_ptr pTVar4;
  TCGContext_conflict1 *pTVar5;
  int iVar6;
  TCGTemp *ts;
  code *pcVar7;
  undefined7 in_register_00000081;
  uint element;
  TCGTemp *local_88;
  TCGv_ptr local_80;
  TCGContext_conflict1 *local_70;
  TCGTemp *local_68;
  undefined4 local_5c;
  TCGTemp *local_58;
  uint local_50;
  int local_4c;
  TCGv_ptr local_48;
  TCGv_i64 local_40;
  TCGv_i32 local_38;
  
  local_50 = (uint)CONCAT71(in_register_00000009,is_u);
  pTVar5 = s->uc->tcg_ctx;
  iVar6 = 0;
  local_4c = size;
  local_48 = get_fpstatus_ptr_aarch64(pTVar5,false);
  local_5c = (undefined4)CONCAT71(in_register_00000011,is_scalar);
  local_70 = pTVar5;
  if ((int)CONCAT71(in_register_00000081,is_q) == 3) {
    pTVar1 = (TCGTemp *)tcg_temp_new_i64(pTVar5);
    local_40 = tcg_temp_new_i64(pTVar5);
    local_58 = (TCGTemp *)((long)&pTVar5->pool_cur + (long)&pTVar1->field_0x0);
    pTVar4 = local_48 + (long)pTVar5;
    ts = (TCGTemp *)(local_40 + (long)pTVar5);
    local_68 = pTVar1;
    for (element = 0; pTVar5 = local_70, element < 2 - is_scalar; element = element + 1) {
      read_vec_element(s,(TCGv_i64)local_68,local_4c,element,MO_64);
      if (opcode == 0x7d) {
        pcVar7 = helper_rsqrte_f64_aarch64;
      }
      else if (opcode == 0x3f) {
        pcVar7 = helper_frecpx_f64_aarch64;
      }
      else {
        if (opcode != 0x3d) {
          iVar6 = 0x26df;
LAB_006401d9:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,iVar6,(char *)0x0);
        }
        pcVar7 = helper_recpe_f64_aarch64;
      }
      local_88 = local_58;
      local_80 = pTVar4;
      tcg_gen_callN_aarch64(local_70,pcVar7,ts,2,&local_88);
      write_vec_element(s,local_40,rn,element,MO_64);
    }
    tcg_temp_free_internal_aarch64(local_70,ts);
    tcg_temp_free_internal_aarch64(pTVar5,local_58);
    is_q_00 = (byte)local_5c ^ 1;
  }
  else {
    pTVar2 = tcg_temp_new_i32(pTVar5);
    local_38 = tcg_temp_new_i32(pTVar5);
    iVar3 = 1;
    if (!is_scalar) {
      iVar3 = (local_50 & 0xff) * 2 + 2;
    }
    local_58 = (TCGTemp *)CONCAT44(local_58._4_4_,iVar3);
    local_68 = (TCGTemp *)(pTVar2 + (long)pTVar5);
    pTVar4 = local_48 + (long)pTVar5;
    pTVar1 = (TCGTemp *)(local_38 + (long)pTVar5);
    local_40 = (TCGv_i64)pTVar2;
    for (; pTVar5 = local_70, (int)local_58 != iVar6; iVar6 = iVar6 + 1) {
      read_vec_element_i32(s,(TCGv_i32)local_40,local_4c,iVar6,MO_32);
      if (opcode == 0x7d) {
        pcVar7 = helper_rsqrte_f32_aarch64;
      }
      else if (opcode == 0x3d) {
        pcVar7 = helper_recpe_f32_aarch64;
      }
      else if (opcode == 0x3f) {
        pcVar7 = helper_frecpx_f32_aarch64;
      }
      else {
        if (opcode != 0x3c) {
          iVar6 = 0x2702;
          goto LAB_006401d9;
        }
        pcVar7 = helper_recpe_u32_aarch64;
      }
      local_88 = local_68;
      local_80 = pTVar4;
      tcg_gen_callN_aarch64(local_70,pcVar7,pTVar1,2,&local_88);
      if ((char)local_5c == '\0') {
        write_vec_element_i32(s,local_38,rn,iVar6,MO_32);
      }
      else {
        write_fp_sreg(s,rn,local_38);
      }
    }
    tcg_temp_free_internal_aarch64(local_70,pTVar1);
    tcg_temp_free_internal_aarch64(pTVar5,local_68);
    is_q_00 = (byte)local_50;
    if ((char)local_5c != '\0') goto LAB_006401a0;
  }
  clear_vec_high(s,(_Bool)is_q_00,rn);
LAB_006401a0:
  tcg_temp_free_internal_aarch64(pTVar5,(TCGTemp *)(local_48 + (long)pTVar5));
  return;
}

Assistant:

static void handle_2misc_reciprocal(DisasContext *s, int opcode,
                                    bool is_scalar, bool is_u, bool is_q,
                                    int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_double = (size == 3);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);

    if (is_double) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);
        int pass;

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
            switch (opcode) {
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }
            write_vec_element(s, tcg_res, rd, pass, MO_64);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_op);
        clear_vec_high(s, !is_scalar, rd);
    } else {
        TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        for (pass = 0; pass < maxpasses; pass++) {
            read_vec_element_i32(s, tcg_op, rn, pass, MO_32);

            switch (opcode) {
            case 0x3c: /* URECPE */
                gen_helper_recpe_u32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }
        }
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_op);
        if (!is_scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
    tcg_temp_free_ptr(tcg_ctx, fpst);
}